

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

MapIterator * __thiscall
google::protobuf::Reflection::MapBegin(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *pMVar2;
  Message *in_RSI;
  MapIterator *in_RDI;
  MapIterator *iter;
  FieldDescriptor *in_stack_00000080;
  Message *in_stack_00000088;
  MapIterator *in_stack_00000090;
  MapIterator *field_00;
  Reflection *in_stack_ffffffffffffffc8;
  
  field_00 = in_RDI;
  bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x427659);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              ((Descriptor *)iter,(FieldDescriptor *)this,(char *)message,(char *)field);
  }
  MapIterator::MapIterator(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  pMVar2 = GetRaw<google::protobuf::internal::MapFieldBase>
                     (in_stack_ffffffffffffffc8,in_RSI,(FieldDescriptor *)field_00);
  (*pMVar2->_vptr_MapFieldBase[6])(pMVar2,in_RDI);
  return field_00;
}

Assistant:

MapIterator Reflection::MapBegin(Message* message,
                                 const FieldDescriptor* field) const {
  USAGE_CHECK(IsMapFieldInApi(field), "MapBegin", "Field is not a map field.");
  MapIterator iter(message, field);
  GetRaw<MapFieldBase>(*message, field).MapBegin(&iter);
  return iter;
}